

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteBaf.c
# Opt level: O0

void Io_WriteBaf(Abc_Ntk_t *pNtk,char *pFileName)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  FILE *__stream;
  char *pcVar5;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  void *__ptr;
  ProgressBar *p;
  Abc_Obj_t *pAVar8;
  void *pvVar9;
  uint *pBufferNode;
  int nBufferSize;
  int nAnds;
  int nNodes;
  int i;
  Abc_Obj_t *pObj;
  FILE *pFile;
  ProgressBar *pProgress;
  char *pFileName_local;
  Abc_Ntk_t *pNtk_local;
  
  iVar2 = Abc_NtkIsStrash(pNtk);
  if (iVar2 == 0) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                  ,0x5b,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
  }
  __stream = fopen(pFileName,"wb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Io_WriteBaf(): Cannot open the output file \"%s\".\n",pFileName);
  }
  else {
    pcVar7 = pNtk->pName;
    pcVar5 = Extra_TimeStamp();
    fprintf(__stream,"# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n",pcVar7,pcVar5);
    fprintf(__stream,"%s%c",pNtk->pName,0);
    uVar3 = Abc_NtkPiNum(pNtk);
    fprintf(__stream,"%d%c",(ulong)uVar3,0);
    uVar3 = Abc_NtkPoNum(pNtk);
    fprintf(__stream,"%d%c",(ulong)uVar3,0);
    uVar3 = Abc_NtkLatchNum(pNtk);
    fprintf(__stream,"%d%c",(ulong)uVar3,0);
    uVar3 = Abc_NtkNodeNum(pNtk);
    fprintf(__stream,"%d%c",(ulong)uVar3,0);
    for (nAnds = 0; iVar2 = Abc_NtkPiNum(pNtk), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkPi(pNtk,nAnds);
      pcVar7 = Abc_ObjName(pAVar6);
      fprintf(__stream,"%s%c",pcVar7,0);
    }
    for (nAnds = 0; iVar2 = Abc_NtkPoNum(pNtk), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkPo(pNtk,nAnds);
      pcVar7 = Abc_ObjName(pAVar6);
      fprintf(__stream,"%s%c",pcVar7,0);
    }
    for (nAnds = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkBox(pNtk,nAnds);
      iVar2 = Abc_ObjIsLatch(pAVar6);
      if (iVar2 != 0) {
        pcVar7 = Abc_ObjName(pAVar6);
        fprintf(__stream,"%s%c",pcVar7,0);
        pAVar8 = Abc_ObjFanin0(pAVar6);
        pcVar7 = Abc_ObjName(pAVar8);
        fprintf(__stream,"%s%c",pcVar7,0);
        pAVar6 = Abc_ObjFanout0(pAVar6);
        pcVar7 = Abc_ObjName(pAVar6);
        fprintf(__stream,"%s%c",pcVar7,0);
      }
    }
    Abc_NtkCleanCopy(pNtk);
    nBufferSize = 1;
    for (nAnds = 0; iVar2 = Abc_NtkCiNum(pNtk), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkCi(pNtk,nAnds);
      pAVar6->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)nBufferSize;
      nBufferSize = nBufferSize + 1;
    }
    for (nAnds = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkObj(pNtk,nAnds);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar6), iVar2 != 0)) {
        pAVar6->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)(long)nBufferSize;
        nBufferSize = nBufferSize + 1;
      }
    }
    pBufferNode._4_4_ = 0;
    iVar2 = Abc_NtkNodeNum(pNtk);
    iVar4 = Abc_NtkCoNum(pNtk);
    iVar4 = iVar2 * 2 + iVar4;
    __ptr = malloc((long)iVar4 << 2);
    p = Extra_ProgressBarStart((FILE *)_stdout,iVar4);
    for (nAnds = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkObj(pNtk,nAnds);
      if ((pAVar6 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar6), iVar2 != 0)) {
        Extra_ProgressBarUpdate(p,pBufferNode._4_4_,(char *)0x0);
        pAVar8 = Abc_ObjFanin0(pAVar6);
        aVar1 = pAVar8->field_6;
        uVar3 = Abc_ObjFaninC0(pAVar6);
        iVar2 = pBufferNode._4_4_ + 1;
        *(uint *)((long)__ptr + (long)pBufferNode._4_4_ * 4) = aVar1.iTemp << 1 | uVar3;
        pAVar8 = Abc_ObjFanin1(pAVar6);
        aVar1 = pAVar8->field_6;
        uVar3 = Abc_ObjFaninC1(pAVar6);
        pBufferNode._4_4_ = pBufferNode._4_4_ + 2;
        *(uint *)((long)__ptr + (long)iVar2 * 4) = aVar1.iTemp << 1 | uVar3;
      }
    }
    for (nAnds = 0; iVar2 = Abc_NtkCoNum(pNtk), nAnds < iVar2; nAnds = nAnds + 1) {
      pAVar6 = Abc_NtkCo(pNtk,nAnds);
      Extra_ProgressBarUpdate(p,pBufferNode._4_4_,(char *)0x0);
      pAVar8 = Abc_ObjFanin0(pAVar6);
      aVar1 = pAVar8->field_6;
      uVar3 = Abc_ObjFaninC0(pAVar6);
      *(uint *)((long)__ptr + (long)pBufferNode._4_4_ * 4) = aVar1.iTemp << 1 | uVar3;
      iVar2 = Abc_ObjFanoutNum(pAVar6);
      if (0 < iVar2) {
        pAVar8 = Abc_ObjFanout0(pAVar6);
        iVar2 = Abc_ObjIsLatch(pAVar8);
        if (iVar2 != 0) {
          iVar2 = *(int *)((long)__ptr + (long)pBufferNode._4_4_ * 4);
          pAVar6 = Abc_ObjFanout0(pAVar6);
          pvVar9 = Abc_ObjData(pAVar6);
          *(uint *)((long)__ptr + (long)pBufferNode._4_4_ * 4) = iVar2 << 2 | (uint)pvVar9 & 3;
        }
      }
      pBufferNode._4_4_ = pBufferNode._4_4_ + 1;
    }
    Extra_ProgressBarStop(p);
    if (iVar4 != pBufferNode._4_4_) {
      __assert_fail("nBufferSize == nAnds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteBaf.c"
                    ,0x9e,"void Io_WriteBaf(Abc_Ntk_t *, char *)");
    }
    fwrite(__ptr,1,(long)iVar4 << 2,__stream);
    fclose(__stream);
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
  }
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

/*
    Binary Aig Format

    The motivation for this format is to have
    - compact binary representation of large AIGs (~10x more compact than BLIF)
    - consequently, fast reading/writing of large AIGs (~10x faster than BLIF)
    - representation for all tech-ind info related to an AIG
    - human-readable file header

    The header:
    (1) May contain several lines of human-readable comments.
        Each comment line begins with symbol '#' and ends with symbol '\n'.
    (2) Always contains the following data. 
        - benchmark name
        - number of primary inputs
        - number of primary outputs
        - number of latches
        - number of AIG nodes (excluding the constant 1 node)
        Each entry is followed by 0-byte (character '\0'):
    (3) Next follow the names of the PIs, POs, and latches in this order. 
        Each name is followed by 0-byte (character '\0').
        Inside each set of names (PIs, POs, latches) there should be no
        identical names but the PO names may coincide with PI/latch names.

    The body:
    (1) First part of the body contains binary information about the internal AIG nodes.
        Each internal AIG node is represented using two edges (each edge is a 4-byte integer). 
        Each integer is the fanin ID followed by 1-bit representation of the complemented attribute.
        (For example, complemented edge to node 10 will be represented as 2*10 + 1 = 21.)
        The IDs of the nodes are created as follows: Constant 1 node has ID=0. 
        CIs (PIs and latch outputs) have 1-based IDs assigned in that order.
        Each node in the array of the internal AIG nodes has the ID assigned in that order.
        The constant 1 node is not written into the file.
    (2) Second part of the body contains binary information about the edges connecting 
        the COs (POs and latch inputs) to the internal AIG nodes.
        Each edge is a 4-byte integer the same way as a node fanin.
        The latch initial value (2 bits) is stored in this integer.
*/

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Writes the AIG in the binary format.]

  Description []
  
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Io_WriteBaf( Abc_Ntk_t * pNtk, char * pFileName )
{
    ProgressBar * pProgress;
    FILE * pFile;
    Abc_Obj_t * pObj;
    int i, nNodes, nAnds, nBufferSize;
    unsigned * pBufferNode;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the output stream
    pFile = fopen( pFileName, "wb" );
    if ( pFile == NULL )
    {
        fprintf( stdout, "Io_WriteBaf(): Cannot open the output file \"%s\".\n", pFileName );
        return;
    }

    // write the comment
    fprintf( pFile, "# BAF (Binary Aig Format) for \"%s\" written by ABC on %s\n", pNtk->pName, Extra_TimeStamp() );

    // write the network name
    fprintf( pFile, "%s%c", pNtk->pName, 0 );
    // write the number of PIs
    fprintf( pFile, "%d%c", Abc_NtkPiNum(pNtk), 0 );
    // write the number of POs
    fprintf( pFile, "%d%c", Abc_NtkPoNum(pNtk), 0 );
    // write the number of latches
    fprintf( pFile, "%d%c", Abc_NtkLatchNum(pNtk), 0 );
    // write the number of internal nodes
    fprintf( pFile, "%d%c", Abc_NtkNodeNum(pNtk), 0 );

    // write PIs
    Abc_NtkForEachPi( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write POs
    Abc_NtkForEachPo( pNtk, pObj, i )
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
    // write latches
    Abc_NtkForEachLatch( pNtk, pObj, i )
    {
        fprintf( pFile, "%s%c", Abc_ObjName(pObj), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanin0(pObj)), 0 );
        fprintf( pFile, "%s%c", Abc_ObjName(Abc_ObjFanout0(pObj)), 0 );
    }

    // set the node numbers to be used in the output file
    Abc_NtkCleanCopy( pNtk );
    nNodes = 1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;
    Abc_AigForEachAnd( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)nNodes++;

    // write the nodes into the buffer
    nAnds = 0;
    nBufferSize = Abc_NtkNodeNum(pNtk) * 2 + Abc_NtkCoNum(pNtk);
    pBufferNode = ABC_ALLOC( unsigned, nBufferSize );
    pProgress = Extra_ProgressBarStart( stdout, nBufferSize );
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        pBufferNode[nAnds++] = (((int)(ABC_PTRINT_T)Abc_ObjFanin1(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC1(pObj);
    }

    // write the COs into the buffer
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        Extra_ProgressBarUpdate( pProgress, nAnds, NULL );
        pBufferNode[nAnds] = (((int)(ABC_PTRINT_T)Abc_ObjFanin0(pObj)->pCopy) << 1) | (int)Abc_ObjFaninC0(pObj);
        if ( Abc_ObjFanoutNum(pObj) > 0 && Abc_ObjIsLatch(Abc_ObjFanout0(pObj)) )
            pBufferNode[nAnds] = (pBufferNode[nAnds] << 2) | ((int)(ABC_PTRINT_T)Abc_ObjData(Abc_ObjFanout0(pObj)) & 3);
        nAnds++;
    }
    Extra_ProgressBarStop( pProgress );
    assert( nBufferSize == nAnds );

    // write the buffer
    fwrite( pBufferNode, 1, sizeof(int) * nBufferSize, pFile );
    fclose( pFile );
    ABC_FREE( pBufferNode );
}